

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsMainTable.cpp
# Opt level: O2

QList<QRect> * __thiscall
KDReports::MainTable::pageRects(QList<QRect> *__return_storage_ptr__,MainTable *this)

{
  (**(code **)(*(long *)&((this->d)._M_t.
                          super___uniq_ptr_impl<KDReports::MainTablePrivate,_std::default_delete<KDReports::MainTablePrivate>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_KDReports::MainTablePrivate_*,_std::default_delete<KDReports::MainTablePrivate>_>
                          .super__Head_base<0UL,_KDReports::MainTablePrivate_*,_false>._M_head_impl)
                         ->m_layout->super_AbstractReportLayout + 0x68))();
  QArrayDataPointer<QRect>::QArrayDataPointer
            (&__return_storage_ptr__->d,
             &(((this->d)._M_t.
                super___uniq_ptr_impl<KDReports::MainTablePrivate,_std::default_delete<KDReports::MainTablePrivate>_>
                ._M_t.
                super__Tuple_impl<0UL,_KDReports::MainTablePrivate_*,_std::default_delete<KDReports::MainTablePrivate>_>
                .super__Head_base<0UL,_KDReports::MainTablePrivate_*,_false>._M_head_impl)->m_layout
              ->m_pageRects).d);
  return __return_storage_ptr__;
}

Assistant:

QList<QRect> KDReports::MainTable::pageRects() const
{
    d->m_layout->ensureLayouted();
    return d->m_layout->m_pageRects;
}